

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

void __thiscall hta::Metric::insert(Metric *this,TimeValue tv)

{
  Aggregate a;
  Aggregate aggregate;
  TimeAggregate ta;
  Row row;
  TimeValue tv_00;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> t;
  TimePoint minimum;
  bool bVar1;
  out_of_range *poVar2;
  Level *this_00;
  pointer pMVar3;
  rep rVar4;
  Level local_290;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  Duration DStack_230;
  duration local_228;
  Duration local_220;
  Row local_218;
  base local_1d8;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  level_time_begin;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  Duration DStack_1a8;
  TimeAggregate local_198;
  undefined1 local_160 [8];
  Aggregate partial_interval;
  type partial_duration;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_118;
  TimePoint level_time_end;
  Level *level;
  Duration interval;
  duration<long,_std::ratio<1L,_1000000000L>_> local_e0;
  string local_d8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Metric *local_20;
  Metric *this_local;
  TimeValue tv_local;
  
  this_local = (Metric *)
               tv.time.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r;
  tv_local.time.
  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r =
       (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)tv.value;
  local_20 = this;
  check_write(this);
  bVar1 = Clock::time_point::operator_cast_to_bool((time_point *)&this_local);
  if (!bVar1) {
    poVar2 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar2,"cannot insert invalid (0) hta::TimePoint");
    __cxa_throw(poVar2,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  bVar1 = std::chrono::operator<=
                    ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&this_local,
                     &(this->previous_time_).
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    );
  if (!bVar1) {
    (this->previous_time_).
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = (rep)this_local;
    level = (Level *)(this->interval_min_).__r;
    this_00 = get_level(this,(Duration)level);
    pMVar3 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
             operator->(&this->storage_metric_);
    level_time_end.
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
           (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
           this_local;
    (*pMVar3->_vptr_Metric[2])
              ((int)tv_local.time.
                    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    .__d.__r,pMVar3,this_local);
    bVar1 = Clock::time_point::operator_cast_to_bool(&this_00->time_current);
    if (!bVar1) {
      (this_00->time_current).
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (rep)this_local;
    }
    local_118.__d.__r =
         (duration)
         interval_end((TimePoint)
                      (this_00->time_current).
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      .__d.__r,(Duration)level);
    while( true ) {
      bVar1 = std::chrono::operator>=
                        ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&this_local,&local_118);
      if (!bVar1) {
        tv_00.value = (Value)tv_local.time.
                             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             .__d.__r;
        tv_00.time.
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               this_local;
        Level::advance(this_00,tv_00);
        return;
      }
      partial_interval.active_time.__r =
           (rep)std::chrono::operator-
                          (&local_118,
                           (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)this_00);
      bVar1 = std::chrono::operator<=
                        (&partial_interval.active_time,
                         (duration<long,_std::ratio<1L,_1000000000L>_> *)&level);
      minimum = tv_local.time;
      if (!bVar1) break;
      rVar4 = Catch::clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                         &partial_interval.active_time);
      Aggregate::Aggregate
                ((Aggregate *)local_160,
                 (Value)minimum.
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        .__d.__r,
                 (Value)minimum.
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        .__d.__r,0.0,0,
                 (double)minimum.
                         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         .__d.__r * (double)rVar4,&partial_interval.active_time);
      t.__d.__r = local_118.__d.__r;
      memcpy(&level_time_begin,local_160,0x30);
      a.maximum = (Value)uStack_1c8;
      a.minimum = (Value)level_time_begin.__d.__r;
      a.sum = (Value)local_1c0;
      a.count = uStack_1b8;
      a.integral = (Value)local_1b0;
      a.active_time.__r = DStack_1a8.__r;
      TimeAggregate::TimeAggregate(&local_198,(TimePoint)t.__d.__r,a);
      ta.aggregate.minimum = local_198.aggregate.minimum;
      ta.time.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = local_198.time.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r;
      ta.aggregate.maximum = local_198.aggregate.maximum;
      ta.aggregate.sum = local_198.aggregate.sum;
      ta.aggregate.count = local_198.aggregate.count;
      ta.aggregate.integral = local_198.aggregate.integral;
      ta.aggregate.active_time.__r = local_198.aggregate.active_time.__r;
      Level::advance(this_00,ta);
      local_1d8.__d.__r =
           (duration)
           std::chrono::operator-(&local_118,(duration<long,_std::ratio<1L,_1000000000L>_> *)&level)
      ;
      local_220.__r = (rep)level;
      Clock::time_point::time_point((time_point *)&local_228,&local_1d8);
      memcpy(&local_258,&this_00->aggregate,0x30);
      aggregate.maximum = (Value)uStack_250;
      aggregate.minimum = (Value)local_258;
      aggregate.sum = (Value)local_248;
      aggregate.count = uStack_240;
      aggregate.integral = (Value)local_238;
      aggregate.active_time.__r = DStack_230.__r;
      Row::Row(&local_218,local_220,(TimePoint)local_228.__r,aggregate);
      row.time.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = local_218.time.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r;
      row.interval.__r = local_218.interval.__r;
      row.aggregate.minimum = local_218.aggregate.minimum;
      row.aggregate.maximum = local_218.aggregate.maximum;
      row.aggregate.sum = local_218.aggregate.sum;
      row.aggregate.count = local_218.aggregate.count;
      row.aggregate.integral = local_218.aggregate.integral;
      row.aggregate.active_time.__r = local_218.aggregate.active_time.__r;
      insert(this,row);
      Level::Level(&local_290,(TimePoint)local_118.__d.__r);
      memcpy(this_00,&local_290,0x38);
      local_118.__d.__r =
           (duration)
           interval_end((TimePoint)
                        (this_00->time_current).
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        .__d.__r,(Duration)level);
    }
    __assert_fail("partial_duration <= interval",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                  ,0x21f,"void hta::Metric::insert(TimeValue)");
  }
  interval.__r._7_1_ = 1;
  poVar2 = (out_of_range *)__cxa_allocate_exception(0x10);
  local_b8.__r = (rep)std::chrono::
                      time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&(this->previous_time_).
                                          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        );
  rVar4 = Catch::clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_b8);
  std::__cxx11::to_string(&local_b0,rVar4);
  std::operator+(&local_90,"trying to add non-monotonic timestamp; previous ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
  std::operator+(&local_70,&local_90," new ");
  local_e0.__r = (rep)std::chrono::
                      time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                          *)&this_local);
  rVar4 = Catch::clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_e0);
  std::__cxx11::to_string(&local_d8,rVar4);
  std::operator+(&local_50,&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
  std::out_of_range::out_of_range(poVar2,(string *)&local_50);
  interval.__r._7_1_ = 0;
  __cxa_throw(poVar2,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void Metric::insert(TimeValue tv)
{
    check_write();
    // Evaluate if these two consistency checks hurt performance
    // Must not have an "invalid" time value... who knows what would happen...
    if (!tv.time)
    {
        throw std::out_of_range("cannot insert invalid (0) hta::TimePoint");
    }
    if (tv.time <= previous_time_)
    {
        throw std::out_of_range("trying to add non-monotonic timestamp; previous " +
                                std::to_string(previous_time_.time_since_epoch().count()) +
                                " new " + std::to_string(tv.time.time_since_epoch().count()));
    }
    previous_time_ = tv.time;

    const auto interval = interval_min_;
    auto& level = get_level(interval);
    // We must do this after get_level, otherwise it confuses the level restore
    storage_metric_->insert(tv);

    if (!level.time_current)
    {
        // level.time_current = interval_begin(tv.time, interval);
        level.time_current = tv.time;
    }
    auto level_time_end = interval_end(level.time_current, interval);
    while (tv.time >= level_time_end)
    {
        // the point doesn't belong in the current interval,
        // but some of it's integral may..
        auto partial_duration = level_time_end - level.time_current;
        assert(partial_duration <= interval);
        // TODO move this into a clever method of Aggregate itself
        Aggregate partial_interval{
            tv.value, tv.value, 0, 0, tv.value * partial_duration.count(), partial_duration
        };
        level.advance({ level_time_end, partial_interval });

        auto level_time_begin = level_time_end - interval;

        // Inform higher levels of this new closed level
        insert({ interval, level_time_begin, level.aggregate });

        // reset the interval at lowest level
        level = Level(level_time_end);
        level_time_end = interval_end(level.time_current, interval);
    }
    level.advance(tv);
}